

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<5,_2,_2>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  undefined8 uVar1;
  float fVar2;
  long lVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  uint uVar7;
  uint uVar8;
  float afStack_30 [2];
  undefined8 local_28;
  float local_20;
  int aiStack_18 [6];
  
  uVar1 = *(undefined8 *)(evalCtx->coords).m_data;
  fVar4 = (float)uVar1;
  fVar5 = (float)((ulong)uVar1 >> 0x20);
  fVar6 = fVar4;
  fVar2 = fVar5;
  if (in0Type != INPUTTYPE_DYNAMIC) {
    fVar6 = 1.2;
    fVar2 = 0.5;
  }
  uVar7 = (int)((uint)(in1Type == INPUTTYPE_DYNAMIC) << 0x1f) >> 0x1f;
  uVar8 = (int)((uint)(in1Type == INPUTTYPE_DYNAMIC) << 0x1f) >> 0x1f;
  fVar4 = (float)(~uVar7 & 0x3f000000 | (uint)fVar4 & uVar7);
  fVar5 = (float)(~uVar8 & 0x3f800000 | (uint)fVar5 & uVar8);
  local_28 = CONCAT44(fVar6 * fVar5,fVar6 * fVar4);
  local_20 = fVar5 * fVar2 + fVar2 * fVar4;
  aiStack_18[2] = 0;
  aiStack_18[3] = 1;
  aiStack_18[4] = 2;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[aiStack_18[lVar3]] = afStack_30[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(outerProduct(in0, in1));
	}